

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_stream.c
# Opt level: O0

cio_error write_some_first_write_partial_at_element_boundary_second_error
                    (cio_io_stream *io_stream,cio_write_buffer *buf,
                    cio_io_stream_write_handler_t handler,void *handler_context)

{
  cio_write_buffer *pcVar1;
  size_t sVar2;
  cio_write_buffer *wb;
  cio_write_buffer *wbh;
  void *handler_context_local;
  cio_io_stream_write_handler_t handler_local;
  cio_write_buffer *buf_local;
  cio_io_stream *io_stream_local;
  
  if (write_some_fake.call_count == 1) {
    pcVar1 = buf->next;
    sVar2 = cio_write_buffer_get_num_buffer_elements(buf);
    if (sVar2 != 0) {
      memcpy(write_check_buffer + write_check_buffer_pos,(pcVar1->data).element.field_0.const_data,
             (pcVar1->data).element.length);
      write_check_buffer_pos = (pcVar1->data).element.length + write_check_buffer_pos;
    }
    (*handler)(io_stream,handler_context,buf,CIO_SUCCESS,(pcVar1->data).element.length);
  }
  else if (write_some_fake.call_count == 2) {
    (*handler)(io_stream,handler_context,buf,CIO_MESSAGE_TOO_LONG,0);
  }
  else {
    write_some_all(io_stream,buf,handler,handler_context);
  }
  return CIO_SUCCESS;
}

Assistant:

static enum cio_error write_some_first_write_partial_at_element_boundary_second_error(struct cio_io_stream *io_stream, struct cio_write_buffer *buf, cio_io_stream_write_handler_t handler, void *handler_context)
{
	struct cio_write_buffer *wbh = buf;
	if (write_some_fake.call_count == 1) {
		struct cio_write_buffer *wb = buf->next;
		if (cio_write_buffer_get_num_buffer_elements(buf) >= 1) {
			memcpy(&write_check_buffer[write_check_buffer_pos], wb->data.element.const_data, wb->data.element.length);
			write_check_buffer_pos += wb->data.element.length;
		}

		handler(io_stream, handler_context, wbh, CIO_SUCCESS, wb->data.element.length);
	} else if (write_some_fake.call_count == 2) {
		handler(io_stream, handler_context, wbh, CIO_MESSAGE_TOO_LONG, 0);
	} else {
		write_some_all(io_stream, wbh, handler, handler_context);
	}

	return CIO_SUCCESS;
}